

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGFreeInclude(xmlRelaxNGIncludePtr_conflict incl)

{
  xmlRelaxNGIncludePtr_conflict incl_local;
  
  if (incl != (xmlRelaxNGIncludePtr_conflict)0x0) {
    if (incl->href != (xmlChar *)0x0) {
      (*xmlFree)(incl->href);
    }
    if (incl->doc != (xmlDocPtr)0x0) {
      xmlFreeDoc(incl->doc);
    }
    if (incl->schema != (xmlRelaxNGPtr)0x0) {
      xmlRelaxNGFree(incl->schema);
    }
    (*xmlFree)(incl);
  }
  return;
}

Assistant:

static void
xmlRelaxNGFreeInclude(xmlRelaxNGIncludePtr incl)
{
    if (incl == NULL)
        return;

    if (incl->href != NULL)
        xmlFree(incl->href);
    if (incl->doc != NULL)
        xmlFreeDoc(incl->doc);
    if (incl->schema != NULL)
        xmlRelaxNGFree(incl->schema);
    xmlFree(incl);
}